

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> * __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::Find1P1CPackage
          (optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>
           *__return_storage_ptr__,PeerManagerImpl *this,CTransactionRef *ptx,NodeId nodeid)

{
  element_type *peVar1;
  bool bVar2;
  CRollingBloomFilter *pCVar3;
  const_reference pvVar4;
  unsigned_long uVar5;
  long lVar6;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *child;
  pointer puVar7;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  Span<const_unsigned_char> vKey_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  Span<const_unsigned_char> vKey_01;
  allocator_type local_e1;
  Package maybe_cpfp_package_1;
  pair<std::shared_ptr<const_CTransaction>,_long> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tx_indices;
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  cpfp_candidates_different_peer;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  cpfp_candidates_same_peer;
  undefined1 local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar3 = RecentRejectsReconsiderableFilter(this);
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&peVar1->m_witness_hash;
  CRollingBloomFilter::contains(pCVar3,vKey);
  TxOrphanage::GetChildrenFromSamePeer(&cpfp_candidates_same_peer,&this->m_orphanage,ptx,nodeid);
  for (child = &(cpfp_candidates_same_peer.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
      child != &(cpfp_candidates_same_peer.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
      child = child + 1) {
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_68,
               &ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10),
               child);
    __l._M_len = 2;
    __l._M_array = (iterator)local_68;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)&cpfp_candidates_different_peer,__l,(allocator_type *)&tx_indices);
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    pCVar3 = RecentRejectsReconsiderableFilter(this);
    GetPackageHash((uint256 *)local_68,
                   (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)&cpfp_candidates_different_peer);
    vKey_00.m_size = 0x20;
    vKey_00.m_data = (uchar *)local_68;
    bVar2 = CRollingBloomFilter::contains(pCVar3,vKey_00);
    if (!bVar2) {
      PackageToValidate::PackageToValidate
                ((PackageToValidate *)local_68,ptx,(CTransactionRef *)child,nodeid,nodeid);
      std::optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>::
      optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true>
                (__return_storage_ptr__,(PackageToValidate *)local_68);
      PackageToValidate::~PackageToValidate((PackageToValidate *)local_68);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)&cpfp_candidates_different_peer);
      goto LAB_00744f73;
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&cpfp_candidates_different_peer);
  }
  TxOrphanage::GetChildrenFromDifferentPeer
            (&cpfp_candidates_different_peer,&this->m_orphanage,ptx,nodeid);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&tx_indices,
             ((long)cpfp_candidates_different_peer.
                    super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)cpfp_candidates_different_peer.
                   super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)local_68);
  uVar5 = 0;
  for (lVar6 = 0;
      (pointer)((long)tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar6) !=
      tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish; lVar6 = lVar6 + 8) {
    tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] = uVar5;
    uVar5 = uVar5 + 1;
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,FastRandomContext&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->m_rng);
  puVar7 = tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (puVar7 == tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->
      super__Optional_base<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_false,_false>)
      ._M_payload.
      super__Optional_payload<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true,_false,_false>
      .super__Optional_payload_base<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>.
      _M_engaged = false;
LAB_00744f5f:
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&tx_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
      ::~vector(&cpfp_candidates_different_peer);
LAB_00744f73:
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&cpfp_candidates_same_peer);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    pvVar4 = std::
             vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             ::at(&cpfp_candidates_different_peer,*puVar7);
    std::pair<std::shared_ptr<const_CTransaction>,_long>::pair(&local_c8,pvVar4);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_68,
               &ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10),
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_c8);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_68;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(&maybe_cpfp_package_1,__l_00,&local_e1);
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    pCVar3 = RecentRejectsReconsiderableFilter(this);
    GetPackageHash((uint256 *)local_68,&maybe_cpfp_package_1);
    vKey_01.m_size = 0x20;
    vKey_01.m_data = (uchar *)local_68;
    bVar2 = CRollingBloomFilter::contains(pCVar3,vKey_01);
    if (!bVar2) {
      PackageToValidate::PackageToValidate
                ((PackageToValidate *)local_68,ptx,&local_c8.first,nodeid,local_c8.second);
      std::optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>::
      optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true>
                (__return_storage_ptr__,(PackageToValidate *)local_68);
      PackageToValidate::~PackageToValidate((PackageToValidate *)local_68);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&maybe_cpfp_package_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c8.first.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_00744f5f;
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&maybe_cpfp_package_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c8.first.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

std::optional<PeerManagerImpl::PackageToValidate> PeerManagerImpl::Find1P1CPackage(const CTransactionRef& ptx, NodeId nodeid)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    const auto& parent_wtxid{ptx->GetWitnessHash()};

    Assume(RecentRejectsReconsiderableFilter().contains(parent_wtxid.ToUint256()));

    // Prefer children from this peer. This helps prevent censorship attempts in which an attacker
    // sends lots of fake children for the parent, and we (unluckily) keep selecting the fake
    // children instead of the real one provided by the honest peer.
    const auto cpfp_candidates_same_peer{m_orphanage.GetChildrenFromSamePeer(ptx, nodeid)};

    // These children should be sorted from newest to oldest. In the (probably uncommon) case
    // of children that replace each other, this helps us accept the highest feerate (probably the
    // most recent) one efficiently.
    for (const auto& child : cpfp_candidates_same_peer) {
        Package maybe_cpfp_package{ptx, child};
        if (!RecentRejectsReconsiderableFilter().contains(GetPackageHash(maybe_cpfp_package))) {
            return PeerManagerImpl::PackageToValidate{ptx, child, nodeid, nodeid};
        }
    }

    // If no suitable candidate from the same peer is found, also try children that were provided by
    // a different peer. This is useful because sometimes multiple peers announce both transactions
    // to us, and we happen to download them from different peers (we wouldn't have known that these
    // 2 transactions are related). We still want to find 1p1c packages then.
    //
    // If we start tracking all announcers of orphans, we can restrict this logic to parent + child
    // pairs in which both were provided by the same peer, i.e. delete this step.
    const auto cpfp_candidates_different_peer{m_orphanage.GetChildrenFromDifferentPeer(ptx, nodeid)};

    // Find the first 1p1c that hasn't already been rejected. We randomize the order to not
    // create a bias that attackers can use to delay package acceptance.
    //
    // Create a random permutation of the indices.
    std::vector<size_t> tx_indices(cpfp_candidates_different_peer.size());
    std::iota(tx_indices.begin(), tx_indices.end(), 0);
    std::shuffle(tx_indices.begin(), tx_indices.end(), m_rng);

    for (const auto index : tx_indices) {
        // If we already tried a package and failed for any reason, the combined hash was
        // cached in m_lazy_recent_rejects_reconsiderable.
        const auto [child_tx, child_sender] = cpfp_candidates_different_peer.at(index);
        Package maybe_cpfp_package{ptx, child_tx};
        if (!RecentRejectsReconsiderableFilter().contains(GetPackageHash(maybe_cpfp_package))) {
            return PeerManagerImpl::PackageToValidate{ptx, child_tx, nodeid, child_sender};
        }
    }
    return std::nullopt;
}